

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

int stb_ps_count(stb_ps *ps)

{
  uint uVar1;
  undefined1 auVar2 [16];
  
  switch((uint)ps & 3) {
  case 0:
    return (int)(ps != (stb_ps *)0x0);
  case 1:
    auVar2._0_4_ = -(uint)(*(int *)(ps + 3) == 0 && *(int *)(ps + -1) == 0);
    auVar2._4_4_ = -(uint)(*(int *)(ps + 7) == 0 && *(int *)(ps + 0xb) == 0);
    auVar2._8_4_ = -(uint)(*(int *)(ps + 0x13) == 0 && *(int *)(ps + 0xf) == 0);
    auVar2._12_4_ = -(uint)(*(int *)(ps + 0x17) == 0 && *(int *)(ps + 0x1b) == 0);
    uVar1 = movmskps(0x1bbc94,auVar2);
    return (uint)(0x4332322132212110 >> ((byte)((uVar1 ^ 0xf) << 2) & 0x3f)) & 7;
  case 2:
    return *(int *)(ps + -2);
  case 3:
    return *(int *)(ps + 5);
  }
}

Assistant:

int stb_ps_count (stb_ps *ps)
{
   switch (3 & (int) ps) {
      case STB_ps_direct:
         return ps != NULL;
      case STB_ps_bucket: {
         stb_ps_bucket *b = GetBucket(ps);
         return (b->p[0] != NULL) + (b->p[1] != NULL) +
                (b->p[2] != NULL) + (b->p[3] != NULL);
      }
      case STB_ps_array: {
         stb_ps_array *a = GetArray(ps);
         return a->count;
      }
      case STB_ps_hash: {
         stb_ps_hash *h = GetHash(ps);
         return h->count;
      }
   }
   return 0;
}